

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::LineWidthParamTestInstance::iterate
          (TestStatus *__return_storage_ptr__,LineWidthParamTestInstance *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  double dVar3;
  VkOffset3D offset;
  undefined8 uVar4;
  bool bVar5;
  VkResult result;
  TestContext *this_00;
  TestLog *log_00;
  InstanceInterface *pIVar6;
  VkPhysicalDevice pVVar7;
  VkCommandBuffer_s **ppVVar8;
  Handle<(vk::HandleType)18> *pHVar9;
  Buffer *this_01;
  size_type sVar10;
  PixelBufferAccess *pPVar11;
  Image *this_02;
  Allocator *allocator;
  ConstPixelBufferAccess *reference;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  float fVar12;
  float fVar13;
  allocator<char> local_501;
  string local_500;
  undefined4 local_4e0;
  allocator<char> local_4d9;
  string local_4d8;
  void *local_4b8;
  deInt32 local_4b0;
  undefined1 local_4a8 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  float lineHalfWidth;
  float xCoord;
  int x;
  float yCoord;
  int y;
  int local_43c;
  int local_438;
  deInt32 frameHeight;
  deInt32 frameWidth;
  TextureFormat local_428;
  undefined1 local_420 [8];
  Texture2D referenceFrame;
  undefined8 uStack_3c8;
  VkSubmitInfo submitInfo;
  deUint64 local_378;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  undefined1 local_360 [8];
  VkPhysicalDeviceProperties deviceProperties;
  VkQueue queue;
  TestLog *log;
  LineWidthParamTestInstance *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  log_00 = tcu::TestContext::getLog(this_00);
  deviceProperties._816_8_ =
       Context::getUniversalQueue((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  DynamicStateBaseClass::beginRenderPass(&this->super_DynamicStateBaseClass);
  pIVar6 = Context::getInstanceInterface
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pVVar7 = Context::getPhysicalDevice
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  (*pIVar6->_vptr_InstanceInterface[5])(pIVar6,pVVar7,local_360);
  DynamicStateBaseClass::setDynamicViewportState(&this->super_DynamicStateBaseClass,0x80,0x80);
  DynamicStateBaseClass::setDynamicBlendState(&this->super_DynamicStateBaseClass,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            (&this->super_DynamicStateBaseClass,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  fVar12 = ::deFloatFloor(deviceProperties.limits.pointSizeRange[1]);
  DynamicStateBaseClass::setDynamicRasterizationState
            (&this->super_DynamicStateBaseClass,fVar12,0.0,0.0,0.0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  this_03 = &(this->super_DynamicStateBaseClass).m_cmdBuffer;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DynamicStateBaseClass).m_pipeline.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar9->m_internal);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DynamicStateBaseClass).m_vertexBuffer);
  local_378 = (deUint64)Draw::Buffer::object(this_01);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,*ppVVar8,0,1,&local_378,&vertexBuffer);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar8;
  sVar10 = std::
           vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
           ::size(&(this->super_DynamicStateBaseClass).m_data);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,pVVar2,sVar10 & 0xffffffff,1,0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar8);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar8);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_3c8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  uVar4 = deviceProperties._816_8_;
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,uVar4,1,&uStack_3c8);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,deviceProperties._816_8_);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateRSTests.cpp"
                    ,0x290);
  local_428 = ::vk::mapVkFormat((this->super_DynamicStateBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_420,&local_428,0x80,0x80);
  tcu::Texture2D::allocLevel((Texture2D *)local_420,0);
  local_438 = tcu::Texture2D::getWidth((Texture2D *)local_420);
  local_43c = tcu::Texture2D::getHeight((Texture2D *)local_420);
  pPVar11 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_420,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&yCoord,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar11,(Vec4 *)&yCoord);
  for (x = 0; x < local_43c; x = x + 1) {
    fVar12 = (float)x / ((float)local_43c * 0.5) - 1.0;
    for (lineHalfWidth = 0.0; (int)lineHalfWidth < local_438;
        lineHalfWidth = (float)((int)lineHalfWidth + 1)) {
      fVar13 = (float)(int)lineHalfWidth / ((float)local_438 * 0.5) + -1.0;
      dVar3 = deFloor((double)deviceProperties.limits.pointSizeRange[1]);
      if ((((-1.0 <= fVar13) && (fVar13 <= 1.0)) && (-(float)(dVar3 / (double)local_43c) <= fVar12))
         && (fVar12 <= (float)(dVar3 / (double)local_43c))) {
        pPVar11 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_420,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.z,0.0,1.0,0.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar11,(Vec4 *)&zeroOffset.z,(int)lineHalfWidth,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_02 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DynamicStateBaseClass).m_colorTargetImage);
  uVar4 = deviceProperties._816_8_;
  allocator = Context::getDefaultAllocator
                        ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  local_4b0 = zeroOffset.x;
  local_4b8 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_4a8,this_02,(VkQueue)uVar4,allocator,
             VK_IMAGE_LAYOUT_GENERAL,offset,0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_420,0)->
               super_ConstPixelBufferAccess;
  bVar5 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_4a8,0.05,COMPARE_LOG_RESULT);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"Image verification passed",&local_501);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator(&local_501);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"Image verification failed",&local_4d9);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
  }
  local_4e0 = 1;
  tcu::Texture2D::~Texture2D((Texture2D *)local_420);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log		= m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		vk::VkPhysicalDeviceProperties deviceProperties;
		m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &deviceProperties);

		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicBlendState();
		setDynamicDepthStencilState();
		setDynamicRasterizationState(deFloatFloor(deviceProperties.limits.lineWidthRange[1]));

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		const vk::VkDeviceSize vertexBufferOffset	= 0;
		const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_data.size()), 1, 0, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

			for (int y = 0; y < frameHeight; y++)
			{
				float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;
					float lineHalfWidth = (float)(deFloor(deviceProperties.limits.lineWidthRange[1]) / frameHeight);

					if (xCoord >= -1.0f && xCoord <= 1.0f && yCoord >= -lineHalfWidth && yCoord <= lineHalfWidth)
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
																							  vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT,
																							  vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}